

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::EndGroup(void)

{
  ImGuiContext *pIVar1;
  ImGuiWindow *pIVar2;
  ImGuiGroupData *rhs;
  bool bVar3;
  float fVar4;
  ImVec2 size;
  ImVec2 nav_bb_arg;
  bool group_contains_prev_active_id;
  bool group_contains_curr_active_id;
  ImRect group_bb;
  ImGuiGroupData *group_data;
  ImGuiWindow *window;
  ImGuiContext *g;
  undefined6 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffae;
  byte bVar5;
  undefined1 in_stack_ffffffffffffffaf;
  ImGuiGroupData *min;
  undefined6 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbe;
  undefined1 in_stack_ffffffffffffffbf;
  ImVec2 in_stack_ffffffffffffffd8;
  ImVec2 local_20;
  
  pIVar1 = GImGui;
  pIVar2 = GetCurrentWindow();
  rhs = ImVector<ImGuiGroupData>::back(&(pIVar2->DC).GroupStack);
  min = rhs;
  size = ImMax((ImVec2 *)
               CONCAT17(in_stack_ffffffffffffffbf,
                        CONCAT16(in_stack_ffffffffffffffbe,in_stack_ffffffffffffffb8)),
               &rhs->BackupCursorPos);
  ImRect::ImRect((ImRect *)&stack0xffffffffffffffd8,&min->BackupCursorPos,
                 (ImVec2 *)&stack0xffffffffffffffd0);
  (pIVar2->DC).CursorPos = rhs->BackupCursorPos;
  nav_bb_arg = ImMax((ImVec2 *)
                     CONCAT17(in_stack_ffffffffffffffbf,
                              CONCAT16(in_stack_ffffffffffffffbe,in_stack_ffffffffffffffb8)),
                     &min->BackupCursorPos);
  (pIVar2->DC).CursorMaxPos = nav_bb_arg;
  (pIVar2->DC).Indent.x = (rhs->BackupIndent).x;
  (pIVar2->DC).GroupOffset.x = (rhs->BackupGroupOffset).x;
  (pIVar2->DC).CurrLineSize = rhs->BackupCurrLineSize;
  (pIVar2->DC).CurrLineTextBaseOffset = rhs->BackupCurrLineTextBaseOffset;
  if ((pIVar1->LogEnabled & 1U) != 0) {
    pIVar1->LogLinePosY = -3.4028235e+38;
  }
  if ((rhs->EmitItem & 1U) == 0) {
    ImVector<ImGuiGroupData>::pop_back(&(pIVar2->DC).GroupStack);
  }
  else {
    fVar4 = ImMax<float>((pIVar2->DC).PrevLineTextBaseOffset,rhs->BackupCurrLineTextBaseOffset);
    (pIVar2->DC).CurrLineTextBaseOffset = fVar4;
    ImRect::GetSize((ImRect *)
                    CONCAT17(in_stack_ffffffffffffffaf,
                             CONCAT16(in_stack_ffffffffffffffae,in_stack_ffffffffffffffa8)));
    ItemSize((ImVec2 *)size,nav_bb_arg.y);
    ItemAdd((ImRect *)in_stack_ffffffffffffffd8,(ImGuiID)size.y,(ImRect *)nav_bb_arg);
    bVar3 = false;
    if ((rhs->BackupActiveIdIsAlive != pIVar1->ActiveId) &&
       (bVar3 = false, pIVar1->ActiveIdIsAlive == pIVar1->ActiveId)) {
      bVar3 = pIVar1->ActiveId != 0;
    }
    bVar5 = 0;
    if ((rhs->BackupActiveIdPreviousFrameIsAlive & 1U) == 0) {
      bVar5 = pIVar1->ActiveIdPreviousFrameIsAlive;
    }
    if (bVar3) {
      (pIVar2->DC).LastItemId = pIVar1->ActiveId;
    }
    else if ((bVar5 & 1) != 0) {
      (pIVar2->DC).LastItemId = pIVar1->ActiveIdPreviousFrame;
    }
    (pIVar2->DC).LastItemRect.Min = in_stack_ffffffffffffffd8;
    (pIVar2->DC).LastItemRect.Max = local_20;
    if ((bVar3) && ((pIVar1->ActiveIdHasBeenEditedThisFrame & 1U) != 0)) {
      (pIVar2->DC).LastItemStatusFlags = (pIVar2->DC).LastItemStatusFlags | 4;
    }
    (pIVar2->DC).LastItemStatusFlags = (pIVar2->DC).LastItemStatusFlags | 0x20;
    if (((bVar5 & 1) != 0) && (pIVar1->ActiveId != pIVar1->ActiveIdPreviousFrame)) {
      (pIVar2->DC).LastItemStatusFlags = (pIVar2->DC).LastItemStatusFlags | 0x40;
    }
    ImVector<ImGuiGroupData>::pop_back(&(pIVar2->DC).GroupStack);
  }
  return;
}

Assistant:

void ImGui::EndGroup()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    IM_ASSERT(!window->DC.GroupStack.empty());  // Mismatched BeginGroup()/EndGroup() calls

    ImGuiGroupData& group_data = window->DC.GroupStack.back();

    ImRect group_bb(group_data.BackupCursorPos, ImMax(window->DC.CursorMaxPos, group_data.BackupCursorPos));

    window->DC.CursorPos = group_data.BackupCursorPos;
    window->DC.CursorMaxPos = ImMax(group_data.BackupCursorMaxPos, window->DC.CursorMaxPos);
    window->DC.Indent = group_data.BackupIndent;
    window->DC.GroupOffset = group_data.BackupGroupOffset;
    window->DC.CurrLineSize = group_data.BackupCurrLineSize;
    window->DC.CurrLineTextBaseOffset = group_data.BackupCurrLineTextBaseOffset;
    if (g.LogEnabled)
        g.LogLinePosY = -FLT_MAX; // To enforce Log carriage return

    if (!group_data.EmitItem)
    {
        window->DC.GroupStack.pop_back();
        return;
    }

    window->DC.CurrLineTextBaseOffset = ImMax(window->DC.PrevLineTextBaseOffset, group_data.BackupCurrLineTextBaseOffset);      // FIXME: Incorrect, we should grab the base offset from the *first line* of the group but it is hard to obtain now.
    ItemSize(group_bb.GetSize());
    ItemAdd(group_bb, 0);

    // If the current ActiveId was declared within the boundary of our group, we copy it to LastItemId so IsItemActive(), IsItemDeactivated() etc. will be functional on the entire group.
    // It would be be neater if we replaced window.DC.LastItemId by e.g. 'bool LastItemIsActive', but would put a little more burden on individual widgets.
    // Also if you grep for LastItemId you'll notice it is only used in that context.
    // (The tests not symmetrical because ActiveIdIsAlive is an ID itself, in order to be able to handle ActiveId being overwritten during the frame.)
    const bool group_contains_curr_active_id = (group_data.BackupActiveIdIsAlive != g.ActiveId) && (g.ActiveIdIsAlive == g.ActiveId) && g.ActiveId;
    const bool group_contains_prev_active_id = !group_data.BackupActiveIdPreviousFrameIsAlive && g.ActiveIdPreviousFrameIsAlive;
    if (group_contains_curr_active_id)
        window->DC.LastItemId = g.ActiveId;
    else if (group_contains_prev_active_id)
        window->DC.LastItemId = g.ActiveIdPreviousFrame;
    window->DC.LastItemRect = group_bb;

    // Forward Edited flag
    if (group_contains_curr_active_id && g.ActiveIdHasBeenEditedThisFrame)
        window->DC.LastItemStatusFlags |= ImGuiItemStatusFlags_Edited;

    // Forward Deactivated flag
    window->DC.LastItemStatusFlags |= ImGuiItemStatusFlags_HasDeactivated;
    if (group_contains_prev_active_id && g.ActiveId != g.ActiveIdPreviousFrame)
        window->DC.LastItemStatusFlags |= ImGuiItemStatusFlags_Deactivated;

    window->DC.GroupStack.pop_back();
    //window->DrawList->AddRect(group_bb.Min, group_bb.Max, IM_COL32(255,0,255,255));   // [Debug]
}